

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void * AllocUnitsRare(CPpmd8 *p,uint indx)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar10;
  long lVar11;
  Byte *pBVar12;
  ulong uVar13;
  Byte *pBVar14;
  uint local_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  Byte *local_38;
  ulong uVar9;
  
  uVar9 = (ulong)indx;
  uVar13 = (ulong)indx;
  uVar10 = uVar9;
  if (p->GlueCount == 0) {
    local_4c = 0;
    p->GlueCount = 0x2000;
    memset(p->Stamps,0,0x98);
    pBVar12 = p->LoUnit;
    if (pBVar12 != p->HiUnit) {
      pBVar12[0] = '\0';
      pBVar12[1] = '\0';
      pBVar12[2] = '\0';
      pBVar12[3] = '\0';
    }
    puVar7 = &local_4c;
    for (lVar4 = 0; lVar4 != 0x26; lVar4 = lVar4 + 1) {
      uVar8 = p->FreeList[lVar4];
      p->FreeList[lVar4] = 0;
      while (uVar8 != 0) {
        pBVar12 = p->Base;
        uVar9 = (ulong)uVar8;
        if (*(int *)(pBVar12 + uVar9 + 8) != 0) {
          *puVar7 = uVar8;
          while( true ) {
            lVar11 = (ulong)*(uint *)(pBVar12 + uVar9 + 8) * 0xc;
            if (*(int *)(pBVar12 + lVar11 + uVar9) != -1) break;
            lVar11 = lVar11 + uVar9;
            *(uint *)(pBVar12 + uVar9 + 8) =
                 *(uint *)(pBVar12 + uVar9 + 8) + *(int *)(pBVar12 + lVar11 + 8);
            pBVar14 = pBVar12 + lVar11 + 8;
            pBVar14[0] = '\0';
            pBVar14[1] = '\0';
            pBVar14[2] = '\0';
            pBVar14[3] = '\0';
          }
          puVar7 = (uint *)(pBVar12 + uVar9 + 4);
        }
        uVar8 = *(uint *)(pBVar12 + uVar9 + 4);
      }
    }
    local_48 = indx;
    local_40 = (ulong)indx;
    *puVar7 = 0;
    local_38 = p->Units2Indx;
    uVar8 = local_4c;
    while (uVar6 = uVar8, uVar6 != 0) {
      pBVar12 = p->Base;
      iVar2 = *(int *)(pBVar12 + (ulong)uVar6 + 8);
      uVar8 = *(uint *)(pBVar12 + (ulong)uVar6 + 4);
      if (iVar2 != 0) {
        pBVar14 = pBVar12 + uVar6;
        local_44 = *(uint *)(pBVar12 + (ulong)uVar6 + 4);
        for (lVar4 = 0; iVar3 = (int)lVar4, 0x80 < (uint)(iVar2 + iVar3); lVar4 = lVar4 + -0x80) {
          InsertNode(p,pBVar14,0x25);
          pBVar14 = pBVar14 + 0x600;
        }
        bVar1 = local_38[lVar4 + (ulong)(iVar2 - 1)];
        uVar8 = (uint)bVar1;
        if (iVar3 + (iVar2 - (uint)p->Indx2Units[bVar1]) != 0) {
          uVar8 = bVar1 - 1;
          InsertNode(p,pBVar14 + (ulong)p->Indx2Units[uVar8] * 0xc,
                     (iVar2 - (uint)p->Indx2Units[uVar8]) + -1 + iVar3);
        }
        InsertNode(p,pBVar14,uVar8);
        uVar8 = local_44;
      }
    }
    uVar5 = (ulong)p->FreeList[local_40];
    uVar9 = (ulong)local_48;
    uVar13 = local_40;
    uVar10 = uVar9;
    if (uVar5 != 0) {
      pBVar12 = p->Base;
      p->FreeList[local_40] = *(CPpmd_Void_Ref *)(pBVar12 + uVar5 + 4);
      p->Stamps[local_40] = p->Stamps[local_40] - 1;
      return pBVar12 + uVar5;
    }
  }
  do {
    if ((int)uVar9 == 0x25) {
      bVar1 = p->Indx2Units[uVar13];
      p->GlueCount = p->GlueCount - 1;
      if ((uint)bVar1 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
        pBVar12 = p->UnitsStart + (ulong)bVar1 * -0xc;
        p->UnitsStart = pBVar12;
        return pBVar12;
      }
      return (void *)0x0;
    }
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    uVar5 = (ulong)p->FreeList[uVar9];
  } while (uVar5 == 0);
  pBVar12 = p->Base + uVar5;
  p->FreeList[uVar9] = *(CPpmd_Void_Ref *)(p->Base + uVar5 + 4);
  p->Stamps[uVar9] = p->Stamps[uVar9] - 1;
  SplitBlock(p,pBVar12,uVar8,(uint)uVar10);
  return pBVar12;
}

Assistant:

static void *AllocUnitsRare(CPpmd8 *p, unsigned indx)
{
  unsigned i;
  void *retVal;
  if (p->GlueCount == 0)
  {
    GlueFreeBlocks(p);
    if (p->FreeList[indx] != 0)
      return RemoveNode(p, indx);
  }
  i = indx;
  do
  {
    if (++i == PPMD_NUM_INDEXES)
    {
      UInt32 numBytes = U2B(I2U(indx));
      p->GlueCount--;
      return ((UInt32)(p->UnitsStart - p->Text) > numBytes) ? (p->UnitsStart -= numBytes) : (NULL);
    }
  }
  while (p->FreeList[i] == 0);
  retVal = RemoveNode(p, i);
  SplitBlock(p, retVal, i, indx);
  return retVal;
}